

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::BlockReferencedByShaderValidator::validate
          (BlockReferencedByShaderValidator *this,Program *program,string *resource,GLint propValue,
          string *implementationName)

{
  int iVar1;
  bool bVar2;
  __type _Var3;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar4;
  size_type sVar5;
  const_reference ppSVar6;
  DefaultBlock *pDVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  char *__s;
  undefined1 auVar10 [16];
  allocator<char> local_3f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  char *local_398;
  MessageBuilder local_390;
  char *local_210;
  char *local_208;
  MessageBuilder local_200;
  const_reference local_80;
  InterfaceBlock *block;
  Shader *pSStack_70;
  int blockNdx;
  Shader *shader;
  int local_58;
  byte local_51;
  int shaderNdx;
  bool referencedByShader;
  string blockName;
  string *implementationName_local;
  string *psStack_20;
  GLint propValue_local;
  string *resource_local;
  Program *program_local;
  BlockReferencedByShaderValidator *this_local;
  
  blockName.field_2._8_8_ = implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_20 = resource;
  resource_local = (string *)program;
  program_local = (Program *)this;
  auVar10 = std::__cxx11::string::c_str();
  glu::parseVariableName_abi_cxx11_((string *)&shaderNdx,auVar10._0_8_,auVar10._8_8_);
  local_51 = 0;
  local_58 = 0;
  while( true ) {
    iVar1 = local_58;
    pvVar4 = ProgramInterfaceDefinition::Program::getShaders((Program *)resource_local);
    sVar5 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
            ::size(pvVar4);
    if ((int)sVar5 <= iVar1) break;
    pvVar4 = ProgramInterfaceDefinition::Program::getShaders((Program *)resource_local);
    ppSVar6 = std::
              vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
              ::operator[](pvVar4,(long)local_58);
    pSStack_70 = *ppSVar6;
    bVar2 = ProgramInterfaceDefinition::VariableSearchFilter::matchesFilter
                      ((VariableSearchFilter *)&(this->super_PropValidator).field_0x2c,pSStack_70);
    if (bVar2) {
      block._4_4_ = 0;
      while( true ) {
        iVar1 = block._4_4_;
        pDVar7 = ProgramInterfaceDefinition::Shader::getDefaultBlock(pSStack_70);
        sVar5 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::size
                          (&pDVar7->interfaceBlocks);
        if ((int)sVar5 <= iVar1) break;
        pDVar7 = ProgramInterfaceDefinition::Shader::getDefaultBlock(pSStack_70);
        local_80 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                   operator[](&pDVar7->interfaceBlocks,(long)block._4_4_);
        bVar2 = ProgramInterfaceDefinition::VariableSearchFilter::matchesFilter
                          ((VariableSearchFilter *)&(this->super_PropValidator).field_0x2c,local_80)
        ;
        if ((bVar2) &&
           (_Var3 = std::operator==(&local_80->interfaceName,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&shaderNdx), _Var3)) {
          local_51 = 1;
        }
        block._4_4_ = block._4_4_ + 1;
      }
    }
    local_58 = local_58 + 1;
  }
  pTVar8 = tcu::TestContext::getLog((this->super_PropValidator).m_testCtx);
  tcu::TestLog::operator<<(&local_200,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_200,(char (*) [25])"Verifying referenced by ");
  local_208 = glu::getShaderTypeName(this->m_shaderType);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_208);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [20])" shader, expecting ");
  local_210 = "GL_FALSE";
  if ((local_51 & 1) != 0) {
    local_210 = "GL_TRUE";
  }
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_210);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_200);
  if (implementationName_local._4_4_ != ((local_51 & 1) != 0)) {
    pTVar8 = tcu::TestContext::getLog((this->super_PropValidator).m_testCtx);
    tcu::TestLog::operator<<(&local_390,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_390,(char (*) [31])"\tError, invalid referenced_by_");
    local_398 = glu::getShaderTypeName(this->m_shaderType);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_398);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [7])0xf925e6);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)((long)&implementationName_local + 4));
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_390);
    __s = glu::getShaderTypeName(this->m_shaderType);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,__s,&local_3f9);
    std::operator+(&local_3d8,"referenced_by_",&local_3f8);
    std::operator+(&local_3b8,&local_3d8," invalid");
    PropValidator::setError(&this->super_PropValidator,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
  }
  std::__cxx11::string::~string((string *)&shaderNdx);
  return;
}

Assistant:

void BlockReferencedByShaderValidator::validate (const ProgramInterfaceDefinition::Program* program, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const std::string	blockName			= glu::parseVariableName(resource.c_str());
	bool				referencedByShader	= false;

	DE_UNREF(implementationName);

	for (int shaderNdx = 0; shaderNdx < (int)program->getShaders().size(); ++shaderNdx)
	{
		const ProgramInterfaceDefinition::Shader* const shader = program->getShaders()[shaderNdx];
		if (!m_filter.matchesFilter(shader))
			continue;

		for (int blockNdx = 0; blockNdx < (int)shader->getDefaultBlock().interfaceBlocks.size(); ++blockNdx)
		{
			const glu::InterfaceBlock& block = shader->getDefaultBlock().interfaceBlocks[blockNdx];

			if (m_filter.matchesFilter(block) && block.interfaceName == blockName)
				referencedByShader = true;
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying referenced by " << glu::getShaderTypeName(m_shaderType) << " shader, expecting "
		<< ((referencedByShader) ? ("GL_TRUE") : ("GL_FALSE"))
		<< tcu::TestLog::EndMessage;

	if (propValue != ((referencedByShader) ? (1) : (0)))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid referenced_by_" << glu::getShaderTypeName(m_shaderType) << ", got " << propValue << tcu::TestLog::EndMessage;
		setError("referenced_by_" + std::string(glu::getShaderTypeName(m_shaderType)) + " invalid");
	}
}